

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O1

void fstk_RunRept(uint32_t count,int32_t reptLineNo,char *body,size_t size)

{
  Context *pCVar1;
  bool bVar2;
  
  if ((count != 0) && (bVar2 = newReptContext(reptLineNo,body,size), pCVar1 = contextStack, bVar2))
  {
    contextStack->nbReptIters = count;
    pCVar1->forName = (char *)0x0;
  }
  return;
}

Assistant:

void fstk_RunRept(uint32_t count, int32_t reptLineNo, char *body, size_t size)
{
	if (count == 0)
		return;
	if (!newReptContext(reptLineNo, body, size))
		return;

	contextStack->nbReptIters = count;
	contextStack->forName = NULL;
}